

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O0

void inipp::detail::rtrim<char>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,locale *loc)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined8 local_50;
  locale *local_48;
  undefined1 local_40 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  undefined8 local_20;
  locale *local_18;
  locale *loc_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_local;
  
  local_18 = loc;
  loc_local = (locale *)s;
  std::__cxx11::string::rbegin();
  std::__cxx11::string::rend();
  local_48 = local_18;
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,inipp::detail::rtrim<char>(std::__cxx11::string&,std::locale_const&)::_lambda(char)_1_>
            (&local_30,&local_38,(locale *)local_40);
  local_28._M_current =
       (char *)std::
               reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::base(&local_30);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_20,&local_28);
  local_58._M_current = (char *)std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_50,&local_58);
  std::__cxx11::string::erase(s,local_20,local_50);
  return;
}

Assistant:

inline void rtrim(std::basic_string<CharT> & s, const std::locale & loc) {
	s.erase(std::find_if(s.rbegin(), s.rend(),
                             [&loc](CharT ch) { return !std::isspace(ch, loc); }).base(),
                s.end());
}